

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool op_ldrd_ri(DisasContext_conflict1 *s,arg_ldst_ri *a,int rt2)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int index;
  TCGv_i32 a32;
  TCGv_i32 pTVar1;
  TCGv_i32 tmp;
  TCGv_i32 addr;
  int mem_idx;
  TCGContext_conflict1 *tcg_ctx;
  int rt2_local;
  arg_ldst_ri *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  index = get_mem_index(s);
  a32 = op_addr_ri_pre(s,a);
  pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
  gen_aa32_ld_i32(s,pTVar1,a32,index,s->be_data | MO_32);
  store_reg(s,a->rt,pTVar1);
  tcg_gen_addi_i32_aarch64(tcg_ctx_00,a32,a32,4);
  pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
  gen_aa32_ld_i32(s,pTVar1,a32,index,s->be_data | MO_32);
  store_reg(s,rt2,pTVar1);
  op_addr_ri_post(s,a,a32,-4);
  return true;
}

Assistant:

static bool op_ldrd_ri(DisasContext *s, arg_ldst_ri *a, int rt2)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int mem_idx = get_mem_index(s);
    TCGv_i32 addr, tmp;

    addr = op_addr_ri_pre(s, a);

    tmp = tcg_temp_new_i32(tcg_ctx);
    gen_aa32_ld_i32(s, tmp, addr, mem_idx, MO_UL | s->be_data);
    store_reg(s, a->rt, tmp);

    tcg_gen_addi_i32(tcg_ctx, addr, addr, 4);

    tmp = tcg_temp_new_i32(tcg_ctx);
    gen_aa32_ld_i32(s, tmp, addr, mem_idx, MO_UL | s->be_data);
    store_reg(s, rt2, tmp);

    /* LDRD w/ base writeback is undefined if the registers overlap.  */
    op_addr_ri_post(s, a, addr, -4);
    return true;
}